

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

uint16_t mqttmessage_getPacketId(MQTT_MESSAGE_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  uint16_t result;
  MQTT_MESSAGE_HANDLE handle_local;
  
  if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
                ,"mqttmessage_getPacketId",0xb6,1,"Invalid Parameter handle: %p.",0);
    }
    l._6_2_ = 0;
  }
  else {
    l._6_2_ = handle->packetId;
  }
  return l._6_2_;
}

Assistant:

uint16_t mqttmessage_getPacketId(MQTT_MESSAGE_HANDLE handle)
{
    uint16_t result;
    if (handle == NULL)
    {
        /* Codes_SRS_MQTTMESSAGE_07_010: [If handle is NULL then mqttmessage_getPacketId shall return 0.] */
        LogError("Invalid Parameter handle: %p.", handle);
        result = 0;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_011: [mqttmessage_getPacketId shall return the packetId value contained in MQTT_MESSAGE_HANDLE handle.] */
        result = handle->packetId;
    }
    return result;
}